

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

U32 ZSTD_getLowestPrefixIndex(ZSTD_matchState_t *ms,U32 curr,uint windowLog)

{
  uint uVar1;
  U32 local_34;
  U32 local_30;
  U32 matchLowest;
  U32 isDictionary;
  U32 withinWindow;
  U32 lowestValid;
  U32 maxDistance;
  uint windowLog_local;
  U32 curr_local;
  ZSTD_matchState_t *ms_local;
  
  uVar1 = 1 << ((byte)windowLog & 0x1f);
  local_34 = (ms->window).dictLimit;
  local_30 = local_34;
  if (uVar1 < curr - local_34) {
    local_30 = curr - uVar1;
  }
  if (ms->loadedDictEnd == 0) {
    local_34 = local_30;
  }
  return local_34;
}

Assistant:

MEM_STATIC U32 ZSTD_getLowestPrefixIndex(const ZSTD_matchState_t* ms, U32 curr, unsigned windowLog)
{
    U32    const maxDistance = 1U << windowLog;
    U32    const lowestValid = ms->window.dictLimit;
    U32    const withinWindow = (curr - lowestValid > maxDistance) ? curr - maxDistance : lowestValid;
    U32    const isDictionary = (ms->loadedDictEnd != 0);
    /* When computing the lowest prefix index we need to take the dictionary into account to handle
     * the edge case where the dictionary and the source are contiguous in memory.
     */
    U32    const matchLowest = isDictionary ? lowestValid : withinWindow;
    return matchLowest;
}